

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,double *boxmin,
               double *boxmax,int bGrowBox)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  bVar7 = bGrowBox != 0;
  if (bVar7 && 0 < dim) {
    uVar5 = 1;
    do {
      if (boxmax[uVar5 - 1] <= boxmin[uVar5 - 1] && boxmin[uVar5 - 1] != boxmax[uVar5 - 1]) {
        bGrowBox = 0;
      }
      bVar7 = bGrowBox != 0;
    } while ((uVar5 < (uint)dim) && (uVar5 = uVar5 + 1, bGrowBox != 0));
  }
  if (0 < count) {
    if ((dim < 1 || points == (double *)0x0) ||
       ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
LAB_003e562d:
      bVar7 = false;
    }
    else if (is_rat) {
      uVar5 = (ulong)(uint)dim;
      dVar8 = points[uVar5];
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        bVar6 = true;
      }
      else {
        do {
          if (count < 2) goto LAB_003e562d;
          count = count + -1;
          dVar8 = points[(long)stride + uVar5];
          points = points + stride;
        } while ((dVar8 == 0.0) && (!NAN(dVar8)));
        bVar6 = false;
      }
      if (bVar7 == false) {
        ON_ArrayScale(dim,1.0 / dVar8,points,boxmin);
        memcpy(boxmax,boxmin,uVar5 * 8);
        points = points + stride;
        count = count + -1;
      }
      bVar7 = bVar6;
      if (0 < count) {
        uVar1 = 1;
        if (1 < dim) {
          uVar1 = (ulong)(uint)dim;
        }
        do {
          dVar8 = points[uVar5];
          if ((dVar8 != 0.0) || (NAN(dVar8))) {
            lVar2 = 0;
            lVar3 = 0;
            do {
              dVar9 = *(double *)((long)points + lVar2) * (1.0 / dVar8);
              if (*(double *)((long)boxmin + lVar2) <= dVar9) {
                if (*(double *)((long)boxmax + lVar2) <= dVar9 &&
                    dVar9 != *(double *)((long)boxmax + lVar2)) {
                  pdVar4 = (double *)((long)boxmax + lVar2);
                  goto LAB_003e5804;
                }
              }
              else {
                pdVar4 = boxmin + lVar3;
LAB_003e5804:
                *pdVar4 = dVar9;
              }
              lVar3 = lVar3 + 1;
              lVar2 = lVar2 + 8;
            } while (uVar1 * 8 != lVar2);
          }
          else {
            bVar7 = false;
          }
          count = count + -1;
          points = points + stride;
        } while (count != 0);
      }
    }
    else {
      if (!bVar7) {
        memcpy(boxmin,points,(ulong)(uint)dim << 3);
        memmove(boxmax,points,(ulong)(uint)dim << 3);
        points = points + stride;
        count = count + -1;
      }
      bVar7 = true;
      if (count != 0) {
        uVar5 = 1;
        if (1 < dim) {
          uVar5 = (ulong)(uint)dim;
        }
        do {
          count = count + -1;
          lVar2 = 0;
          lVar3 = 0;
          do {
            dVar8 = *(double *)((long)points + lVar2);
            if (*(double *)((long)boxmin + lVar2) <= dVar8) {
              if (*(double *)((long)boxmax + lVar2) <= dVar8 &&
                  dVar8 != *(double *)((long)boxmax + lVar2)) {
                pdVar4 = (double *)((long)boxmax + lVar2);
                goto LAB_003e5726;
              }
            }
            else {
              pdVar4 = boxmin + lVar3;
LAB_003e5726:
              *pdVar4 = dVar8;
            }
            lVar3 = lVar3 + 1;
            lVar2 = lVar2 + 8;
          } while (uVar5 * 8 != lVar2);
          points = points + stride;
        } while (count != 0);
      }
    }
  }
  return bVar7;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    double* boxmin, double* boxmax,
    int bGrowBox
    )
/*****************************************************************************
Bounding Box of a set of points
 
INPUT:
  dim           ( >= 1 ) dimension of each point
  is_rat        ( true if points are rational )
  count         ( >= 1 ) number of points
  stride        ( >= (is_rat)?(dim+1):dim )
  points        array of dim*count doubles
  boxmin, boxmax      unused arrays of dim doubles
  bGrowBox       true if input box should be enlarged to contain points
										boxmin[i]>boxmax[i] for some i, represents an empty initial box
                 false if input box should be ignored bounding box of points
                       is returned
OUTPUT:
  boxmin, boxmax      diagonal corners of bounding box
*****************************************************************************/
{
  // OBSOLETE
  // bounding box workhorse
  double x, w;
  int j;
  bool rc = false;
  for ( j = 0; j < dim && bGrowBox; j++ )
  {
    if ( boxmin[j] > boxmax[j] )
      bGrowBox = false;
  }

  if ( count > 0 ) 
  {
    if ( is_rat )
    {
      is_rat = 1;
    }
    if ( points && dim > 0 && (count == 1 || stride >= dim+is_rat) ) 
    {
      // input is valid list of a least 1 point

      if ( is_rat ) 
      {
        // bounding box of homogeneous rational points
        rc = true;
        while ( count > 0 && points[dim] == 0.0 ) 
        {
          count--;
          points += stride;
          rc = false;
        }
        if ( count > 0 ) 
        {
          if ( !bGrowBox  )
          {
            ON_ArrayScale( dim, 1.0/points[dim], points, boxmin );
            memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
            points += stride;
            count--;
            bGrowBox = true;
          }
          if ( count > 0 ) 
          {
            for ( /*empty*/; count--; points += stride ) 
            {
              if ( points[dim] == 0.0 ) {
                rc = false;
                continue;
              }
              w = 1.0/points[dim];
              for ( j = 0; j < dim; j++ ) 
              {
                x = w*points[j];
                if (boxmin[j] > x) 
                  boxmin[j] = x; 
                else if (boxmax[j] < x) 
                  boxmax[j] = x;
              }
            }
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        rc = true;
        if ( !bGrowBox ) 
        {
          // use first point to initialize box 
          memcpy( boxmin, points, dim*sizeof(*boxmin) );
          memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
          points += stride;
          count--;
          bGrowBox = true;
        }
        if ( count ) 
        {
          // grow box to contain the rest of the points
          for ( /*empty*/; count--; points += stride ) 
          {
            for ( j = 0; j < dim; j++ ) 
            {
              x = points[j];
              if (boxmin[j] > x) 
                boxmin[j] = x; 
              else if (boxmax[j] < x) 
                boxmax[j] = x;
            }
          }
        }
      }
    }
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = true;
  }
  return rc;
}